

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::ModportDeclarationSyntax::setChild
          (ModportDeclarationSyntax *this,size_t index,TokenOrSyntax child)

{
  long in_RSI;
  
  (*(code *)(&DAT_00c91ee4 + *(int *)(&DAT_00c91ee4 + in_RSI * 4)))();
  return;
}

Assistant:

void ModportDeclarationSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: keyword = child.token(); return;
        case 2: items = child.node()->as<SeparatedSyntaxList<ModportItemSyntax>>(); return;
        case 3: semi = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}